

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::count(StringRef *this,StringRef Str)

{
  StringRef RHS;
  bool bVar1;
  StringRef local_58;
  size_t local_48;
  size_t e;
  size_t i;
  size_t N;
  size_t Count;
  StringRef *this_local;
  StringRef Str_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (StringRef *)Str.Data;
  N = 0;
  Count = (size_t)this;
  i = size((StringRef *)&this_local);
  if (this->Length < i) {
    Str_local.Length = 0;
  }
  else {
    e = 0;
    local_48 = (this->Length - i) + 1;
    for (; e != local_48; e = e + 1) {
      local_58 = substr(this,e,i);
      RHS.Length = (size_t)Str_local.Data;
      RHS.Data = (char *)this_local;
      bVar1 = equals(&local_58,RHS);
      if (bVar1) {
        N = N + 1;
      }
    }
    Str_local.Length = N;
  }
  return Str_local.Length;
}

Assistant:

size_t StringRef::count(StringRef Str) const {
  size_t Count = 0;
  size_t N = Str.size();
  if (N > Length)
    return 0;
  for (size_t i = 0, e = Length - N + 1; i != e; ++i)
    if (substr(i, N).equals(Str))
      ++Count;
  return Count;
}